

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O1

void addIconFiles<int>(QStringView prefix,initializer_list<int> sizes,QIcon *icon,Mode mode,
                      State state)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  int local_d0;
  int local_cc;
  QArrayData *local_c8;
  char16_t *pcStack_c0;
  qsizetype local_b8;
  QStringBuilder<QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString>,_QLatin1String>
  local_b0;
  QSize local_80 [3];
  QStringBuilder<QLatin1String,_QStringView_&> local_68;
  QStringView local_48;
  long local_38;
  
  local_48.m_data = prefix.m_data;
  local_48.m_size = prefix.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.b = &local_48;
  local_68.a.m_size = 0x2b;
  local_68.a.m_data = ":/qt-project.org/styles/commonstyle/images/";
  if (sizes._M_len != 0) {
    lVar2 = 0;
    do {
      iVar1 = *(int *)((long)sizes._M_array + lVar2);
      QString::number((int)&local_c8,iVar1);
      local_b0.a.b.d.size = local_b8;
      local_b0.a.b.d.ptr = pcStack_c0;
      local_b0.a.b.d.d = (Data *)local_c8;
      local_b8 = 0;
      local_b0.a.a = &local_68;
      local_c8 = (QArrayData *)0x0;
      pcStack_c0 = (char16_t *)0x0;
      local_b0.b.m_size = 4;
      local_b0.b.m_data = ".png";
      QStringBuilder<QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString>,_QLatin1String>
      ::convertTo<QString>((QString *)local_80,&local_b0);
      local_d0 = iVar1;
      local_cc = iVar1;
      QIcon::addFile((QString *)icon,local_80,(Mode)&local_d0,mode);
      if (local_80[0] != (QSize)0x0) {
        LOCK();
        *(int *)local_80[0] = *(int *)local_80[0] + -1;
        UNLOCK();
        if (*(int *)local_80[0] == 0) {
          QArrayData::deallocate((QArrayData *)local_80[0],2,0x10);
        }
      }
      if (&(local_b0.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b0.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b0.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if (((local_b0.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_b0.a.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_c8 != (QArrayData *)0x0) {
        LOCK();
        (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c8,2,0x10);
        }
      }
      lVar2 = lVar2 + 4;
    } while (sizes._M_len << 2 != lVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void addIconFiles(QStringView prefix, std::initializer_list<T> sizes, QIcon &icon,
                         QIcon::Mode mode = QIcon::Normal, QIcon::State state = QIcon::Off)
{
    const auto fullPrefix = iconResourcePrefix() + prefix;
    for (int size : sizes)
        icon.addFile(fullPrefix + QString::number(size) + iconPngSuffix(),
                     QSize(size, size), mode, state);
}